

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O1

LPCUTF8 __thiscall Js::Utf8SourceInfo::GetSource(Utf8SourceInfo *this,char16 *reason)

{
  uchar *puVar1;
  ISourceHolder *pIVar2;
  code *pcVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  char16_t *pcVar7;
  
  if ((this->sourceHolder).ptr == (ISourceHolder *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x3e,"(this->sourceHolder != nullptr)","We have no source mapper.")
    ;
    if (!bVar4) goto LAB_007d5d86;
    *puVar6 = 0;
  }
  puVar1 = (this->debugModeSource).ptr;
  if (((puVar1 == (uchar *)0x0) && ((this->field_0xa8 & 0x20) == 0)) ||
     ((this->field_0xa8 & 0x40) == 0)) {
    pIVar2 = (this->sourceHolder).ptr;
    pcVar7 = L"Utf8SourceInfo::GetSource";
    if (reason != (char16 *)0x0) {
      pcVar7 = reason;
    }
    iVar5 = (*(pIVar2->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[6])(pIVar2,pcVar7);
    return (LPCUTF8)CONCAT44(extraout_var,iVar5);
  }
  if ((puVar1 == (uchar *)0x0) && ((this->field_0xa8 & 0x20) == 0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x42,
                                "(this->debugModeSource != nullptr || this->debugModeSourceIsEmpty)"
                                ,"Debug mode source should have been set by this point.");
    if (!bVar4) {
LAB_007d5d86:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  return (this->debugModeSource).ptr;
}

Assistant:

LPCUTF8 Utf8SourceInfo::GetSource(const char16 * reason) const
    {
        AssertMsg(this->sourceHolder != nullptr, "We have no source mapper.");
#ifdef ENABLE_SCRIPT_DEBUGGING
        if (this->IsInDebugMode())
        {
            AssertMsg(this->debugModeSource != nullptr || this->debugModeSourceIsEmpty, "Debug mode source should have been set by this point.");
            return debugModeSource;
        }
        else
#endif
        {
            return sourceHolder->GetSource(reason == nullptr ? _u("Utf8SourceInfo::GetSource") : reason);
        }
    }